

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void __thiscall JsonParser_serialize_boolean_Test::TestBody(JsonParser_serialize_boolean_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_140 [8];
  Message local_138 [15];
  bool local_129;
  object local_128;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_e0;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  Message local_a8 [31];
  bool local_89;
  object local_88;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_48;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  json_parser parser;
  JsonParser_serialize_boolean_Test *this_local;
  
  jessilib::json_parser::json_parser((json_parser *)&gtest_ar.message_);
  local_89 = true;
  jessilib::object::object<bool,_nullptr>(&local_88,&local_89);
  jessilib::parser::serialize<char8_t>(&local_48,(parser *)&gtest_ar.message_,&local_88);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_char8_t[5],_nullptr>
            ((EqHelper *)local_28,"parser.serialize<char8_t>(true)","u8\"true\"",&local_48,
             (char8_t (*) [5])0x69229e);
  std::__cxx11::u8string::~u8string((u8string *)&local_48);
  jessilib::object::~object(&local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0x22,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  local_129 = false;
  jessilib::object::object<bool,_nullptr>(&local_128,&local_129);
  jessilib::parser::serialize<char8_t>(&local_e0,(parser *)&gtest_ar.message_,&local_128);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_char8_t[6],_nullptr>
            ((EqHelper *)local_c0,"parser.serialize<char8_t>(false)","u8\"false\"",&local_e0,
             (char8_t (*) [6])0x6922bc);
  std::__cxx11::u8string::~u8string((u8string *)&local_e0);
  jessilib::object::~object(&local_128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(local_138);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              (local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0x23,pcVar2);
    testing::internal::AssertHelper::operator=(local_140,local_138);
    testing::internal::AssertHelper::~AssertHelper(local_140);
    testing::Message::~Message(local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  return;
}

Assistant:

TEST(JsonParser, serialize_boolean) {
	json_parser parser;

	EXPECT_EQ(parser.serialize<char8_t>(true), u8"true");
	EXPECT_EQ(parser.serialize<char8_t>(false), u8"false");
}